

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O2

uint __thiscall Fossilize::CLIParser::next_uint(CLIParser *this)

{
  unsigned_long uVar1;
  char *__ptr;
  size_t sStack_50;
  allocator local_39;
  string local_38;
  
  if (this->argc == 0) {
    __ptr = "Fossilize ERROR: Tried to parse uint, but nothing left in arguments.\n";
    sStack_50 = 0x45;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,*this->argv,&local_39);
    uVar1 = std::__cxx11::stoul(&local_38,(size_t *)0x0,10);
    std::__cxx11::string::_M_dispose();
    if (uVar1 >> 0x20 == 0) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (uint)uVar1;
    }
    __ptr = "Fossilize ERROR: next_uint() out of range.\n";
    sStack_50 = 0x2b;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

unsigned CLIParser::next_uint()
{
	if (!argc)
	{
		LOGE("Tried to parse uint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stoul(*argv);
	if (val > numeric_limits<unsigned>::max())
	{
		LOGE("next_uint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return unsigned(val);
}